

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O2

S2PointLoopSpan __thiscall
S2::PruneDegeneracies
          (S2 *this,S2PointLoopSpan loop,
          vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *new_vertices)

{
  pointer *ppVVar1;
  BasicVector<Vector3,_double,_3UL> *this_00;
  bool bVar2;
  pointer pVVar3;
  pointer pVVar4;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *this_01;
  size_type sVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  iterator __begin1;
  long lVar9;
  S2PointLoopSpan SVar10;
  
  this_01 = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
            loop.super_S2PointSpan.len_;
  pVVar3 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  if ((this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar3) {
    (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar3;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
            (this_01,(size_type)loop.super_S2PointSpan.ptr_);
  lVar6 = (long)loop.super_S2PointSpan.ptr_ * 0x18;
  lVar9 = 0x18;
  do {
    if (lVar6 == 0) {
      this_00 = (BasicVector<Vector3,_double,_3UL> *)
                (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pVVar3 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      sVar5 = 0;
      pVVar4 = (pointer)0x0;
      if (2 < (ulong)(((long)pVVar3 - (long)this_00) / 0x18)) {
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          (this_00,pVVar3 + -1);
        if (bVar2) {
          ppVVar1 = &(this_01->
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + -1;
        }
        uVar8 = 0xfffffffe;
        uVar7 = 0xffffffffffffffff;
        lVar6 = -0x100000000;
        do {
          bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)
                             ((long)((this_01->
                                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->c_ + lVar9),
                             (this_01->
                             super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)
                             ._M_impl.super__Vector_impl_data._M_finish + (lVar6 >> 0x20));
          uVar8 = uVar8 + 2;
          uVar7 = uVar7 + 1;
          lVar6 = lVar6 + -0x100000000;
          lVar9 = lVar9 + 0x18;
        } while (bVar2);
        pVVar3 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4 = pVVar3 + (uVar7 & 0xffffffff);
        sVar5 = ((long)(this_01->
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) / 0x18 -
                (ulong)uVar8;
      }
      SVar10.super_S2PointSpan.len_ = sVar5;
      SVar10.super_S2PointSpan.ptr_ = pVVar4;
      return (S2PointLoopSpan)SVar10.super_S2PointSpan;
    }
    pVVar3 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pVVar4 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (pVVar3 == pVVar4) {
LAB_0023ee56:
      if (1 < (ulong)(((long)pVVar4 - (long)pVVar3) / 0x18)) {
        bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)this,pVVar4 + -2);
        if (bVar2) {
          ppVVar1 = &(this_01->
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppVVar1 = *ppVVar1 + -1;
          goto LAB_0023ee89;
        }
      }
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                (this_01,(value_type *)this);
    }
    else {
      bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                        ((BasicVector<Vector3,_double,_3UL> *)this,pVVar4 + -1);
      if (bVar2) {
        pVVar3 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pVVar4 = (this_01->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        goto LAB_0023ee56;
      }
    }
LAB_0023ee89:
    this = (S2 *)((BasicVector<Vector3,_double,_3UL> *)this + 0x18);
    lVar6 = lVar6 + -0x18;
  } while( true );
}

Assistant:

S2PointLoopSpan PruneDegeneracies(S2PointLoopSpan loop,
                                  vector<S2Point>* new_vertices) {
  vector<S2Point>& vertices = *new_vertices;
  vertices.clear();
  vertices.reserve(loop.size());
  for (const S2Point& v : loop) {
    // Remove duplicate vertices.
    if (vertices.empty() || v != vertices.back()) {
      // Remove edge pairs of the form ABA.
      if (vertices.size() >= 2 && v == vertices.end()[-2]) {
        vertices.pop_back();
      } else {
        vertices.push_back(v);
      }
    }
  }
  // Check whether the loop was completely degenerate.
  if (vertices.size() < 3) return S2PointLoopSpan();

  // Otherwise some portion of the loop is guaranteed to be non-degenerate.
  // However there may still be some degenerate portions to remove.
  if (vertices[0] == vertices.back()) vertices.pop_back();

  // If the loop begins with BA and ends with A, then there is an edge pair of
  // the form ABA at the end/start of the loop.  Remove all such pairs.  As
  // noted above, this is guaranteed to leave a non-degenerate loop.
  int k = 0;
  while (vertices[k + 1] == vertices.end()[-(k + 1)]) ++k;
  return S2PointLoopSpan(vertices.data() + k, vertices.size() - 2 * k);
}